

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

char  [7] kj::_::operator*(String *param_1,undefined8 *param_2,undefined8 param_3,undefined8 param_4
                          ,ArrayPtr<const_char> *param_5)

{
  char *__s;
  char *__s_00;
  StringPtr local_40;
  char *local_30;
  size_t local_28;
  
  __s = (char *)*param_2;
  local_28 = strlen(__s);
  __s_00 = (char *)param_2[1];
  local_30 = __s;
  local_40.content.size_ = strlen(__s_00);
  local_40.content.ptr = __s_00;
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (param_1,(_ *)&local_30,(ArrayPtr<const_char> *)(param_2 + 2),&local_40,param_5);
  return SUB87(param_1,0);
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}